

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall gl4cts::DirectStateAccess::Textures::CopyTest::Test<2u>(CopyTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  CreateSourceTexture<2u>(this);
  CreateSourceFramebuffer<2u>(this);
  CreateDestinationTexture<2u>(this);
  bVar1 = CopyTextureSubImage2DAndCheckErrors(this,this->m_to_dst,0,0,0,0,0,2,2);
  bVar2 = CopyTextureSubImage2DAndCheckErrors(this,this->m_to_dst,0,2,0,2,0,2,2);
  bVar3 = CopyTextureSubImage2DAndCheckErrors(this,this->m_to_dst,0,0,2,0,2,2,2);
  bVar4 = CopyTextureSubImage2DAndCheckErrors(this,this->m_to_dst,0,2,2,2,2,2,2);
  bVar5 = CheckData(this,0xde1,0x40);
  CleanAll(this);
  return bVar5 && ((bVar4 && bVar3) && (bVar2 && bVar1));
}

Assistant:

bool CopyTest::Test<2>()
{
	CreateAll<2>();

	bool result = true;

	result &= CopyTextureSubImage2DAndCheckErrors(m_to_dst, 0, 0, 0, 0, 0, s_texture_width / 2, s_texture_height / 2);
	result &= CopyTextureSubImage2DAndCheckErrors(m_to_dst, 0, s_texture_width / 2, 0, s_texture_width / 2, 0,
												  s_texture_width / 2, s_texture_height / 2);
	result &= CopyTextureSubImage2DAndCheckErrors(m_to_dst, 0, 0, s_texture_height / 2, 0, s_texture_height / 2,
												  s_texture_width / 2, s_texture_height / 2);
	result &=
		CopyTextureSubImage2DAndCheckErrors(m_to_dst, 0, s_texture_width / 2, s_texture_height / 2, s_texture_width / 2,
											s_texture_height / 2, s_texture_width / 2, s_texture_height / 2);

	result &= CheckData(TextureTarget<2>(), 4 /* RGBA */ * s_texture_width * s_texture_height);

	CleanAll();

	return result;
}